

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.c
# Opt level: O2

wchar_t wc_to_mb(wchar_t codepage,wchar_t flags,wchar_t *wcstr,wchar_t wclen,char *mbstr,
                wchar_t mblen,char *defchr)

{
  size_t __n;
  wchar_t wVar1;
  long lVar2;
  wchar_t n;
  wchar_t wVar3;
  wchar_t local_5c;
  mbstate_t state;
  wchar_t *local_50;
  char output [16];
  
  local_5c = wclen;
  local_50 = wcstr;
  if (codepage == L'\xffff') {
    state.__count = L'\0';
    state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
    wVar3 = L'\0';
    for (; L'\0' < wclen; wclen = wclen + L'\xffffffff') {
      __n = wcrtomb(output,*wcstr,(mbstate_t *)&state);
      if (__n == 0xffffffffffffffff) {
        return wVar3;
      }
      if ((ulong)(long)(wVar3 - mblen) < __n) {
        return wVar3;
      }
      memcpy(mbstr + wVar3,output,__n);
      wVar3 = (int)__n + wVar3;
      wcstr = wcstr + 1;
    }
  }
  else if (codepage == L'\0') {
    wVar3 = L'\0';
    while ((L'\0' < wclen && (wVar3 < mblen))) {
      wVar1 = *wcstr;
      if ((wVar1 & 0xffffff00U) == 0xd800) {
LAB_00106656:
        lVar2 = (long)wVar3;
        wVar3 = wVar3 + L'\x01';
        mbstr[lVar2] = (char)wVar1;
      }
      else if (defchr != (char *)0x0) {
        wVar1 = (wchar_t)(byte)*defchr;
        goto LAB_00106656;
      }
      wcstr = wcstr + 1;
      wclen = wclen + L'\xffffffff';
    }
  }
  else {
    wVar3 = charset_from_unicode
                      (&local_50,&local_5c,mbstr,mblen,codepage,(charset_state *)0x0,defchr,
                       (uint)(defchr != (char *)0x0));
  }
  return wVar3;
}

Assistant:

int wc_to_mb(int codepage, int flags, const wchar_t *wcstr, int wclen,
             char *mbstr, int mblen, const char *defchr)
{
    if (codepage == DEFAULT_CODEPAGE) {
        char output[MB_LEN_MAX];
        mbstate_t state;
        int n = 0;

        memset(&state, 0, sizeof state);

        while (wclen > 0) {
            size_t i = wcrtomb(output, wcstr[0], &state);
            if (i == (size_t)-1 || i > n - mblen)
                break;
            memcpy(mbstr+n, output, i);
            n += i;
            wcstr++;
            wclen--;
        }

        return n;
    } else if (codepage == CS_NONE) {
        int n = 0;
        while (wclen > 0 && n < mblen) {
            if (*wcstr >= 0xD800 && *wcstr < 0xD900)
                mbstr[n++] = (*wcstr & 0xFF);
            else if (defchr)
                mbstr[n++] = *defchr;
            wcstr++;
            wclen--;
        }
        return n;
    } else {
        return charset_from_unicode(&wcstr, &wclen, mbstr, mblen, codepage,
                                    NULL, defchr?defchr:NULL, defchr?1:0);
    }
}